

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_set_t::ast_set_t(ast_set_t *this,string *identifier,ast_item_t *chain)

{
  ast_item_t *chain_local;
  string *identifier_local;
  ast_set_t *this_local;
  
  ast_item_t::ast_item_t(&this->super_ast_item_t);
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0013a560;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  this->chain = chain;
  return;
}

Assistant:

ast_set_t::ast_set_t(const std::string& identifier, ast_item_t* chain):identifier(identifier), chain(chain) {
    ;
  }